

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

bool __thiscall FM::OPN::Init(OPN *this,uint c,uint r,bool ip,char *param_4)

{
  byte bVar1;
  
  (this->super_OPNBase).clock = c;
  (this->super_OPNBase).psgrate = r;
  bVar1 = (this->super_OPNBase).prescale;
  (this->super_OPNBase).prescale = 0xff;
  OPNBase::SetPrescaler(&this->super_OPNBase,(uint)bVar1);
  (*(this->super_OPNBase).super_Timer._vptr_Timer[3])(this);
  (this->super_OPNBase).fmvolume = 0x4000;
  PSG::SetVolume(&(this->super_OPNBase).psg,0);
  SetChannelMask(this,0);
  return true;
}

Assistant:

bool OPN::Init(uint c, uint r, bool ip, const char*)
{
	if (!SetRate(c, r, ip))
		return false;

	Reset();

	SetVolumeFM(0);
	SetVolumePSG(0);
	SetChannelMask(0);
	return true;
}